

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O1

void __thiscall
sisl::cartesian_cubic<float>::set_extension_type
          (cartesian_cubic<float> *this,LatticeExtensionType *e,LatticeRegionShift *s)

{
  LatticeExtensionType LVar1;
  undefined8 *puVar2;
  
  LVar1 = *e;
  if (*s == NoShift && LVar1 == ForceZero) {
    this->m_Shift = NoShift;
    this->m_Extension = LVar1;
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "Not implemented";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

virtual void set_extension_type(const LatticeExtensionType &e,
                                        const LatticeRegionShift &s) {
            // Check validity of the extension type
            if(s == LatticeRegionShift::NoShift && e == LatticeExtensionType::ForceZero) {
                m_Shift = s;
                m_Extension = e;
            }
            else 
                throw "Not implemented";
        }